

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# istring.h
# Opt level: O0

bool __thiscall wasm::IString::startsWith<9>(IString *this,char (*str) [9])

{
  bool bVar1;
  string_view local_28;
  char (*local_18) [9];
  char (*str_local) [9];
  IString *this_local;
  
  local_18 = str;
  str_local = (char (*) [9])this;
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_28,*str);
  bVar1 = startsWith(this,local_28);
  return bVar1;
}

Assistant:

bool startsWith(const char (&str)[N]) {
    return startsWith(std::string_view(str));
  }